

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

void __thiscall VCCluster::delItem(VCCluster *this,VCFace *f)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  double dVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  const_iterator __position;
  SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
  tmp;
  scalar_difference_op<double> local_21;
  SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
  local_20;
  
  p_Var1 = &(this->items)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(VCFace **)(p_Var4 + 1) < f]) {
    if (*(VCFace **)(p_Var4 + 1) >= f) {
      p_Var5 = p_Var4;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (__position._M_node = p_Var5, f < *(VCFace **)(p_Var5 + 1))) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    std::
    _Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>::
    erase_abi_cxx11_((_Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>
                      *)&this->items,__position);
    this->area = this->area - f->area;
    dVar2 = f->area;
    dVar3 = (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1];
    (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] =
         (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0] -
         (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0] * dVar2;
    (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] =
         dVar3 - (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1] * dVar2;
    (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] =
         (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2] -
         dVar2 * (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
    f->cluster = (VCCluster *)0x0;
    local_20.m_matrix = &this->E;
    local_20.m_functor = &local_21;
    Eigen::
    SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
    ::operator=(&local_20,&f->E);
    (*this->_vptr_VCCluster[1])(this,f);
  }
  return;
}

Assistant:

void VCCluster::delItem(VCFace* f) {
	auto it = items.find(f);
	if (it != items.end()) {
		items.erase(it);
		area -= f->area;
		weightedSum = weightedSum - f->center * f->area;
		f->cluster = NULL;
		E -= f->E;
		delItemAdditionalAct(f);
	}
}